

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.hpp
# Opt level: O1

void __thiscall
jsoncons::jsonschema::evaluation_results::merge
          (evaluation_results *this,evaluation_results *results)

{
  _Hash_node_base *p_Var1;
  range *prVar2;
  evaluation_results *in_RAX;
  __hashtable *__h;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  range *prVar3;
  evaluation_results *local_28;
  
  local_28 = in_RAX;
  for (p_Var1 = (results->evaluated_properties)._M_h._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    local_28 = this;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this,p_Var1 + 1,&local_28);
  }
  prVar3 = (results->evaluated_items).ranges_.
           super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prVar2 = (results->evaluated_items).ranges_.
           super__Vector_base<jsoncons::jsonschema::range,_std::allocator<jsoncons::jsonschema::range>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar3 != prVar2) {
    do {
      range_collection::insert(&this->evaluated_items,*prVar3);
      prVar3 = prVar3 + 1;
    } while (prVar3 != prVar2);
  }
  return;
}

Assistant:

void merge(const evaluation_results& results)
        {
            for (auto&& name : results.evaluated_properties)
            {
                evaluated_properties.insert(name);
            }
            for (auto index_range : results.evaluated_items)
            {
                evaluated_items.insert(index_range);
            }
        }